

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

void __thiscall vm::VM::buildStringLiteralPool(VM *this)

{
  pointer pCVar1;
  int *piVar2;
  addr_t aVar3;
  variant_alternative_t<0UL,_variant<basic_string<char>,_int,_double>_> *pvVar4;
  mapped_type *pmVar5;
  long lVar6;
  pointer pCVar7;
  u2 i;
  str_t str;
  key_type local_52;
  long local_50;
  int local_48;
  undefined4 uStack_44;
  
  local_52 = 0;
  pCVar1 = (this->_file).constants.super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pCVar7 = (this->_file).constants.
                super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
                super__Vector_impl_data._M_start; pCVar7 != pCVar1; pCVar7 = pCVar7 + 1) {
    if (pCVar7->type == STRING) {
      pvVar4 = std::get<0ul,std::__cxx11::string,int,double>(&pCVar7->value);
      std::__cxx11::string::string((string *)&local_50,(string *)pvVar4);
      aVar3 = NEW(this,local_48 + 1);
      pmVar5 = std::__detail::
               _Map_base<unsigned_short,_std::pair<const_unsigned_short,_int>,_std::allocator<std::pair<const_unsigned_short,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_short,_std::pair<const_unsigned_short,_int>,_std::allocator<std::pair<const_unsigned_short,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->_stringLiteralPool,&local_52);
      *pmVar5 = aVar3;
      piVar2 = (this->_heap)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
               super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl;
      for (lVar6 = 0; CONCAT44(uStack_44,local_48) != lVar6; lVar6 = lVar6 + 1) {
        piVar2[(long)aVar3 + lVar6 + -0x1000000] = (uint)*(byte *)(local_50 + lVar6);
      }
      piVar2[(long)aVar3 + lVar6 + -0x1000000] = 0;
      std::__cxx11::string::~string((string *)&local_50);
    }
    local_52 = local_52 + 1;
  }
  return;
}

Assistant:

void VM::buildStringLiteralPool() {
    u2 i = 0;
    for (auto it = _file.constants.begin(), ed = _file.constants.end(); it != ed; ++it) {
        auto& c = *it;
        if (c.type == vm::Constant::Type::STRING) {
            str_t str = std::get<str_t>(c.value);
            addr_t addr = NEW(str.length()+1);
            _stringLiteralPool[i] = addr;
            slot_t* dst =  toHeapPtr(addr);
            for (auto ch : str) {
                *dst++ = ch & 0xff;
            }
            *dst = '\0';
        }
        ++i;
    }
}